

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis_transcode.cpp
# Opt level: O2

ktx_error_code_e
ktxTexture2_TranscodeBasis
          (ktxTexture2 *This,ktx_transcode_fmt_e outputFormat,ktx_transcode_flags transcodeFlags)

{
  ktx_uint32_t *pkVar1;
  ktxTexture_protected *pkVar2;
  ktxTexture_protected *pkVar3;
  ktxTexture2_private *pkVar4;
  ktx_uint8_t *__ptr;
  uint uVar5;
  ktxFormatSizeFlags kVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  ktx_bool_t kVar11;
  uint uVar12;
  ktx_error_code_e kVar13;
  byte bVar14;
  uint uVar15;
  ktx_uint32_t kVar16;
  ktxTexture2_private *pkVar17;
  ktxTexture2 *prototype;
  alpha_content_e local_70;
  ktx_uint32_t local_6c;
  ktxTexture2_private **local_68;
  ktxTextureCreateInfo local_60;
  
  pkVar1 = This->pDfd;
  uVar15 = pkVar1[3] & 0xff;
  if (uVar15 == 0xa6) {
    pkVar17 = This->_private;
    if (This->supercompressionScheme == KTX_SS_BASIS_LZ) goto LAB_0011865f;
  }
  else {
    if (This->supercompressionScheme != KTX_SS_BASIS_LZ) {
      return KTX_INVALID_OPERATION;
    }
    pkVar17 = This->_private;
LAB_0011865f:
    if (pkVar17->_supercompressionGlobalData == (ktx_uint8_t *)0x0) {
      return KTX_INVALID_OPERATION;
    }
    if (pkVar17->_sgdByteLength == 0) {
      return KTX_INVALID_OPERATION;
    }
  }
  local_68 = &This->_private;
  if ((transcodeFlags & 2) == 0) {
    if (((outputFormat & ~KTX_TTF_ETC2_RGBA) == KTX_TF_PVRTC1_4_OPAQUE_ONLY) &&
       ((uVar12 = This->baseWidth - 1, (This->baseWidth ^ uVar12) <= uVar12 ||
        (uVar12 = This->baseHeight - 1, (This->baseHeight ^ uVar12) <= uVar12)))) {
      basisu::debug_printf
                ("ktxTexture_TranscodeBasis: PVRTC1 only supports power of 2 dimensions\n");
      return KTX_INVALID_OPERATION;
    }
    if (uVar15 == 0xa3) {
      local_70 = eNone;
      if (((pkVar1[2] >> 0x12) - 6 & 0xfffffffc) == 8) {
        bVar14 = *(byte *)((long)pkVar1 + 0x2f) & 0xf;
        if (bVar14 == 4) {
          local_70 = eGreen;
        }
        else {
          if (bVar14 != 0xf) {
            return KTX_FILE_DATA_ERROR;
          }
          local_70 = eAlpha;
        }
      }
    }
    else {
      bVar14 = *(byte *)((long)pkVar1 + 0x1f) & 0xf;
      local_70 = (uint)(bVar14 == 5) * 2;
      if (bVar14 == 3) {
        local_70 = eAlpha;
      }
    }
    uVar12 = pkVar1[3] & 0xff0000;
    if (outputFormat == KTX_TTF_PVRTC1_4_RGBA) {
      outputFormat = 9 - (local_70 == eNone);
switchD_001187b9_caseD_8:
      kVar16 = (uint)(uVar12 == 0x20000) * 4 + 0x3b9b9cf1;
      goto LAB_001188ab;
    }
    if (outputFormat == KTX_TTF_PVRTC2_4_RGBA) {
      outputFormat = 0x13 - (local_70 == eNone);
switchD_001187b9_caseD_12:
      kVar16 = (uint)(uVar12 == 0x20000) * 4 + 0x3b9b9cf3;
      goto LAB_001188ab;
    }
    if (outputFormat == KTX_TF_ETC2) {
      outputFormat = (ktx_transcode_fmt_e)(local_70 != eNone);
LAB_0011879a:
      kVar13 = KTX_INVALID_VALUE;
      switch(outputFormat) {
      case KTX_TF_ETC1:
        kVar16 = (uVar12 == 0x20000) + 0x93;
        outputFormat = eNone;
        break;
      case KTX_TTF_ETC2_RGBA:
        kVar16 = (uVar12 == 0x20000) + 0x97;
        outputFormat = eAlpha;
        break;
      case KTX_TF_BC1:
        goto switchD_001187b9_caseD_2;
      case KTX_TF_BC3:
switchD_001187b9_caseD_3:
        kVar16 = (uVar12 == 0x20000) + 0x89;
        outputFormat = eGreen|eAlpha;
        break;
      case KTX_TF_BC4:
        kVar16 = 0x8b;
        break;
      case KTX_TF_BC5:
        kVar16 = 0x8d;
        break;
      case KTX_TF_BC7_M6_OPAQUE_ONLY:
        kVar16 = (uVar12 == 0x20000) + 0x91;
        outputFormat = 6;
        break;
      default:
        goto switchD_001187b9_caseD_7;
      case KTX_TF_PVRTC1_4_OPAQUE_ONLY:
      case KTX_TTF_PVRTC1_4_RGBA:
        goto switchD_001187b9_caseD_8;
      case KTX_TTF_ASTC_4x4_RGBA:
        kVar16 = (uVar12 == 0x20000) + 0x9d;
        outputFormat = 10;
        break;
      case KTX_TTF_RGBA32:
        kVar16 = 0x25;
        if (uVar12 == 0x20000) {
          kVar16 = 0x2b;
        }
        outputFormat = 0xd;
        break;
      case KTX_TTF_RGB565:
        kVar16 = 4;
        break;
      case KTX_TTF_BGR565:
        kVar16 = 5;
        break;
      case KTX_TTF_RGBA4444:
        kVar16 = 2;
        break;
      case KTX_TTF_PVRTC2_4_RGB:
      case KTX_TTF_PVRTC2_4_RGBA:
        goto switchD_001187b9_caseD_12;
      case KTX_TTF_ETC2_EAC_R11:
        kVar16 = 0x99;
        break;
      case KTX_TTF_ETC2_EAC_RG11:
        kVar16 = 0x9b;
      }
    }
    else {
      if (outputFormat != KTX_TTF_BC1_OR_3) goto LAB_0011879a;
      if (local_70 != eNone) goto switchD_001187b9_caseD_3;
switchD_001187b9_caseD_2:
      kVar16 = (uVar12 == 0x20000) + 0x83;
      outputFormat = eGreen;
    }
LAB_001188ab:
    bVar10 = basist::basis_is_format_supported(outputFormat,(uint)(uVar15 == 0xa6));
    if (bVar10) {
      local_60.glInternalformat = 0;
      local_60.baseWidth = This->baseWidth;
      local_60.baseHeight = This->baseHeight;
      local_60.baseDepth = This->baseDepth;
      local_60.generateMipmaps = This->generateMipmaps;
      local_60.isArray = This->isArray;
      local_60.numDimensions = This->numDimensions;
      local_60.numLevels = This->numLevels;
      local_60.numLayers = This->numLayers;
      local_60.numFaces = This->numFaces;
      local_60.pDfd = (ktx_uint32_t *)0x0;
      local_6c = kVar16;
      local_60.vkFormat = kVar16;
      kVar13 = ktxTexture2_Create(&local_60,KTX_TEXTURE_CREATE_ALLOC_STORAGE,&prototype);
      if (kVar13 != KTX_SUCCESS) {
        if (kVar13 == KTX_OUT_OF_MEMORY) {
          return KTX_OUT_OF_MEMORY;
        }
        __assert_fail("result == KTX_OUT_OF_MEMORY",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/basis_transcode.cpp"
                      ,0x139,
                      "ktx_error_code_e ktxTexture2_TranscodeBasis(ktxTexture2 *, ktx_transcode_fmt_e, ktx_transcode_flags)"
                     );
      }
      if (This->pData == (ktx_uint8_t *)0x0) {
        kVar11 = ktxTexture_isActiveStream((ktxTexture *)This);
        if (!kVar11) {
          kVar13 = KTX_INVALID_OPERATION;
          goto LAB_00118a98;
        }
        kVar13 = ktxTexture2_LoadImageData(This,(ktx_uint8_t *)0x0,0);
        if (kVar13 != KTX_SUCCESS) goto LAB_00118a98;
      }
      if (ktxTexture2_TranscodeBasis::transcoderInitialized == '\0') {
        basist::basisu_transcoder_init();
        ktxTexture2_TranscodeBasis::transcoderInitialized = '\x01';
      }
      if (uVar15 == 0xa6) {
        kVar13 = ktxTexture2_transcodeUastc(This,local_70,prototype,outputFormat,transcodeFlags);
      }
      else {
        kVar13 = ktxTexture2_transcodeLzEtc1s(This,local_70,prototype,outputFormat,transcodeFlags);
      }
      if (kVar13 == KTX_SUCCESS) {
        pkVar2 = This->_protected;
        pkVar3 = prototype->_protected;
        pkVar4 = prototype->_private;
        kVar6 = (pkVar3->_formatSize).flags;
        uVar7 = (pkVar3->_formatSize).paletteSizeInBits;
        uVar8 = (pkVar3->_formatSize).blockSizeInBits;
        uVar9 = (pkVar3->_formatSize).blockWidth;
        uVar15 = (pkVar3->_formatSize).blockDepth;
        uVar12 = (pkVar3->_formatSize).minBlocksX;
        uVar5 = (pkVar3->_formatSize).minBlocksY;
        (pkVar2->_formatSize).blockHeight = (pkVar3->_formatSize).blockHeight;
        (pkVar2->_formatSize).blockDepth = uVar15;
        (pkVar2->_formatSize).minBlocksX = uVar12;
        (pkVar2->_formatSize).minBlocksY = uVar5;
        (pkVar2->_formatSize).flags = kVar6;
        (pkVar2->_formatSize).paletteSizeInBits = uVar7;
        (pkVar2->_formatSize).blockSizeInBits = uVar8;
        (pkVar2->_formatSize).blockWidth = uVar9;
        This->vkFormat = local_6c;
        This->isCompressed = prototype->isCompressed;
        This->supercompressionScheme = KTX_SS_BEGIN_RANGE;
        pkVar17->_requiredLevelAlignment = pkVar4->_requiredLevelAlignment;
        memcpy(pkVar17->_levelIndex,pkVar4->_levelIndex,(ulong)This->numLevels * 0x18);
        free(This->pDfd);
        This->pDfd = prototype->pDfd;
        prototype->pDfd = (ktx_uint32_t *)0x0;
        free(This->pData);
        This->pData = prototype->pData;
        This->dataSize = prototype->dataSize;
        prototype->dataSize = 0;
        prototype->pData = (ktx_uint8_t *)0x0;
        pkVar17 = This->_private;
        pkVar17->_sgdByteLength = 0;
        __ptr = pkVar17->_supercompressionGlobalData;
        if (__ptr != (ktx_uint8_t *)0x0) {
          free(__ptr);
          (*local_68)->_supercompressionGlobalData = (ktx_uint8_t *)0x0;
        }
      }
LAB_00118a98:
      ktxTexture2_Destroy(prototype);
      return kVar13;
    }
  }
  else {
    basisu::debug_printf
              ("ktxTexture_TranscodeBasis: KTX_TF_PVRTC_DECODE_TO_NEXT_POW2 currently unsupported\n"
              );
  }
  kVar13 = KTX_UNSUPPORTED_FEATURE;
switchD_001187b9_caseD_7:
  return kVar13;
}

Assistant:

KTX_error_code
 ktxTexture2_TranscodeBasis(ktxTexture2* This,
                            ktx_transcode_fmt_e outputFormat,
                            ktx_transcode_flags transcodeFlags)
{
    uint32_t* BDB = This->pDfd + 1;
    khr_df_model_e colorModel = (khr_df_model_e)KHR_DFDVAL(BDB, MODEL);
    if (colorModel != KHR_DF_MODEL_UASTC
        // Constructor has checked color model matches BASIS_LZ.
        && This->supercompressionScheme != KTX_SS_BASIS_LZ)
    {
        return KTX_INVALID_OPERATION; // Not in a transcodable format.
    }

    DECLARE_PRIVATE(priv, This);
    if (This->supercompressionScheme == KTX_SS_BASIS_LZ) {
        if (!priv._supercompressionGlobalData || priv._sgdByteLength == 0)
            return KTX_INVALID_OPERATION;
    }

    if (transcodeFlags & KTX_TF_PVRTC_DECODE_TO_NEXT_POW2) {
         debug_printf("ktxTexture_TranscodeBasis: KTX_TF_PVRTC_DECODE_TO_NEXT_POW2 currently unsupported\n");
         return KTX_UNSUPPORTED_FEATURE;
    }

    if (outputFormat == KTX_TTF_PVRTC1_4_RGB
        || outputFormat == KTX_TTF_PVRTC1_4_RGBA) {
         if ((!isPow2(This->baseWidth)) || (!isPow2(This->baseHeight))) {
             debug_printf("ktxTexture_TranscodeBasis: PVRTC1 only supports power of 2 dimensions\n");
             return KTX_INVALID_OPERATION;
        }
    }

    const bool srgb = (KHR_DFDVAL(BDB, TRANSFER) == KHR_DF_TRANSFER_SRGB);
    alpha_content_e alphaContent = eNone;
    if (colorModel == KHR_DF_MODEL_ETC1S) {
        if (KHR_DFDSAMPLECOUNT(BDB) == 2) {
            uint32_t channelId = KHR_DFDSVAL(BDB, 1, CHANNELID);
            if (channelId == KHR_DF_CHANNEL_ETC1S_AAA) {
                alphaContent = eAlpha;
            } else if (channelId == KHR_DF_CHANNEL_ETC1S_GGG){
                alphaContent = eGreen;
            } else {
                return KTX_FILE_DATA_ERROR;
            }
        }
    } else {
        uint32_t channelId = KHR_DFDSVAL(BDB, 0, CHANNELID);
        if (channelId == KHR_DF_CHANNEL_UASTC_RGBA)
            alphaContent = eAlpha;
        else if (channelId == KHR_DF_CHANNEL_UASTC_RRRG)
            alphaContent = eGreen;
    }

    VkFormat vkFormat;

    // Do some format mapping.
    switch (outputFormat) {
      case KTX_TTF_BC1_OR_3:
        outputFormat = alphaContent != eNone ? KTX_TTF_BC3_RGBA
                                             : KTX_TTF_BC1_RGB;
        break;
      case KTX_TTF_ETC:
        outputFormat = alphaContent != eNone ? KTX_TTF_ETC2_RGBA
                                             : KTX_TTF_ETC1_RGB;
        break;
      case KTX_TTF_PVRTC1_4_RGBA:
        // This transcoder does not write opaque alpha blocks.
        outputFormat = alphaContent != eNone  ? KTX_TTF_PVRTC1_4_RGBA
                                              : KTX_TTF_PVRTC1_4_RGB;
        break;
      case KTX_TTF_PVRTC2_4_RGBA:
        // This transcoder does not write opaque alpha blocks.
        outputFormat = alphaContent != eNone ? KTX_TTF_PVRTC2_4_RGBA
                                              : KTX_TTF_PVRTC2_4_RGB;
        break;
      default:
        /*NOP*/;
    }

    switch (outputFormat) {
      case KTX_TTF_ETC1_RGB:
        vkFormat = srgb ? VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK
                        : VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK;
        break;
      case KTX_TTF_ETC2_RGBA:
        vkFormat = srgb ? VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK
                        : VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK;
        break;
      case KTX_TTF_ETC2_EAC_R11:
        vkFormat = VK_FORMAT_EAC_R11_UNORM_BLOCK;
        break;
      case KTX_TTF_ETC2_EAC_RG11:
        vkFormat = VK_FORMAT_EAC_R11G11_UNORM_BLOCK;
        break;
      case KTX_TTF_BC1_RGB:
        // Transcoding doesn't support BC1 alpha.
        vkFormat = srgb ? VK_FORMAT_BC1_RGB_SRGB_BLOCK
                        : VK_FORMAT_BC1_RGB_UNORM_BLOCK;
        break;
      case KTX_TTF_BC3_RGBA:
        vkFormat = srgb ? VK_FORMAT_BC3_SRGB_BLOCK
                        : VK_FORMAT_BC3_UNORM_BLOCK;
        break;
      case KTX_TTF_BC4_R:
        vkFormat = VK_FORMAT_BC4_UNORM_BLOCK;
        break;
      case KTX_TTF_BC5_RG:
        vkFormat = VK_FORMAT_BC5_UNORM_BLOCK;
        break;
      case KTX_TTF_PVRTC1_4_RGB:
      case KTX_TTF_PVRTC1_4_RGBA:
        vkFormat = srgb ? VK_FORMAT_PVRTC1_4BPP_SRGB_BLOCK_IMG
                        : VK_FORMAT_PVRTC1_4BPP_UNORM_BLOCK_IMG;
        break;
      case KTX_TTF_PVRTC2_4_RGB:
      case KTX_TTF_PVRTC2_4_RGBA:
        vkFormat = srgb ? VK_FORMAT_PVRTC2_4BPP_SRGB_BLOCK_IMG
                        : VK_FORMAT_PVRTC2_4BPP_UNORM_BLOCK_IMG;
        break;
      case KTX_TTF_BC7_RGBA:
        vkFormat = srgb ? VK_FORMAT_BC7_SRGB_BLOCK
                        : VK_FORMAT_BC7_UNORM_BLOCK;
        break;
      case KTX_TTF_ASTC_4x4_RGBA:
        vkFormat = srgb ? VK_FORMAT_ASTC_4x4_SRGB_BLOCK
                        : VK_FORMAT_ASTC_4x4_UNORM_BLOCK;
        break;
      case KTX_TTF_RGB565:
        vkFormat = VK_FORMAT_R5G6B5_UNORM_PACK16;
        break;
      case KTX_TTF_BGR565:
        vkFormat = VK_FORMAT_B5G6R5_UNORM_PACK16;
        break;
      case KTX_TTF_RGBA4444:
        vkFormat = VK_FORMAT_R4G4B4A4_UNORM_PACK16;
        break;
      case KTX_TTF_RGBA32:
        vkFormat = srgb ? VK_FORMAT_R8G8B8A8_SRGB
                        : VK_FORMAT_R8G8B8A8_UNORM;
        break;
      default:
        return KTX_INVALID_VALUE;
    }

    basis_tex_format textureFormat;
    if (colorModel == KHR_DF_MODEL_UASTC)
        textureFormat = basis_tex_format::cUASTC4x4;
    else
        textureFormat = basis_tex_format::cETC1S;

    if (!basis_is_format_supported((transcoder_texture_format)outputFormat,
                                    textureFormat)) {
        return KTX_UNSUPPORTED_FEATURE;
    }


    // Create a prototype texture to use for calculating sizes in the target
    // format and, as useful side effects, provide us with a properly sized
    // data allocation and the DFD for the target format.
    ktxTextureCreateInfo createInfo;
    createInfo.glInternalformat = 0;
    createInfo.vkFormat = vkFormat;
    createInfo.baseWidth = This->baseWidth;
    createInfo.baseHeight = This->baseHeight;
    createInfo.baseDepth = This->baseDepth;
    createInfo.generateMipmaps = This->generateMipmaps;
    createInfo.isArray = This->isArray;
    createInfo.numDimensions = This->numDimensions;
    createInfo.numFaces = This->numFaces;
    createInfo.numLayers = This->numLayers;
    createInfo.numLevels = This->numLevels;
    createInfo.pDfd = nullptr;

    KTX_error_code result;
    ktxTexture2* prototype;
    result = ktxTexture2_Create(&createInfo, KTX_TEXTURE_CREATE_ALLOC_STORAGE,
                                &prototype);

    if (result != KTX_SUCCESS) {
        assert(result == KTX_OUT_OF_MEMORY); // The only run time error
        return result;
    }

    if (!This->pData) {
        if (ktxTexture_isActiveStream((ktxTexture*)This)) {
             // Load pending. Complete it.
            result = ktxTexture2_LoadImageData(This, NULL, 0);
            if (result != KTX_SUCCESS)
            {
                ktxTexture2_Destroy(prototype);
                return result;
            }
        } else {
            // No data to transcode.
            ktxTexture2_Destroy(prototype);
            return KTX_INVALID_OPERATION;
        }
    }

    // Transcoder global initialization. Requires ~9 milliseconds when compiled
    // and executed natively on a Core i7 2.2 GHz. If this is too slow, the
    // tables it computes can easily be moved to be compiled in.
    static bool transcoderInitialized;
    if (!transcoderInitialized) {
        basisu_transcoder_init();
        transcoderInitialized = true;
    }

    if (textureFormat == basis_tex_format::cETC1S) {
        result = ktxTexture2_transcodeLzEtc1s(This, alphaContent,
                                            prototype, outputFormat,
                                            transcodeFlags);
    } else {
        result = ktxTexture2_transcodeUastc(This, alphaContent,
                                            prototype, outputFormat,
                                            transcodeFlags);
    }

    if (result == KTX_SUCCESS) {
        // Fix up the current texture
        DECLARE_PROTECTED(thisPrtctd, This);
        DECLARE_PRIVATE(protoPriv, prototype);
        DECLARE_PROTECTED(protoPrtctd, prototype);
        memcpy(&thisPrtctd._formatSize, &protoPrtctd._formatSize,
               sizeof(ktxFormatSize));
        This->vkFormat = vkFormat;
        This->isCompressed = prototype->isCompressed;
        This->supercompressionScheme = KTX_SS_NONE;
        priv._requiredLevelAlignment = protoPriv._requiredLevelAlignment;
        // Copy the levelIndex from the prototype to This.
        memcpy(priv._levelIndex, protoPriv._levelIndex,
               This->numLevels * sizeof(ktxLevelIndexEntry));
        // Move the DFD and data from the prototype to This.
        free(This->pDfd);
        This->pDfd = prototype->pDfd;
        prototype->pDfd = 0;
        free(This->pData);
        This->pData = prototype->pData;
        This->dataSize = prototype->dataSize;
        prototype->pData = 0;
        prototype->dataSize = 0;
        // Free SGD data
        This->_private->_sgdByteLength = 0;
        if (This->_private->_supercompressionGlobalData) {
            free(This->_private->_supercompressionGlobalData);
            This->_private->_supercompressionGlobalData = NULL;
        }
    }
    ktxTexture2_Destroy(prototype);
    return result;
 }